

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

IRNode * __thiscall kratos::Expr::get_child(Expr *this,uint64_t index)

{
  Var *pVVar1;
  
  if (index == 1) {
    pVVar1 = this->right;
  }
  else if (index == 0) {
    pVVar1 = this->left;
  }
  else {
    pVVar1 = (Var *)0x0;
  }
  return &pVVar1->super_IRNode;
}

Assistant:

IRNode *Expr::get_child(uint64_t index) {
    if (index == 0)
        return left;
    else if (index == 1)
        return right ? right : nullptr;
    else
        return nullptr;
}